

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O2

void __thiscall duckdb::SQLLogicTestRunner::Reconnect(SQLLogicTestRunner *this)

{
  unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *this_00;
  _Alloc_hider __p;
  type args;
  pointer this_01;
  type pCVar1;
  long lVar2;
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  long *local_88;
  long *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string local_38;
  
  args = unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator*(&this->db)
  ;
  make_uniq<duckdb::Connection,duckdb::DuckDB&>((duckdb *)&local_a8,args);
  __p._M_p = local_a8._M_dataplus._M_p;
  this_00 = &this->con;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<duckdb::Connection,_std::default_delete<duckdb::Connection>_>::reset
            ((__uniq_ptr_impl<duckdb::Connection,_std::default_delete<duckdb::Connection>_> *)
             this_00,(pointer)__p._M_p);
  std::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>_>::~unique_ptr
            ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>_> *)&local_a8);
  if (this->original_sqlite_test == true) {
    unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
              (this_00);
    std::__cxx11::string::string
              ((string *)&local_a8,"SET integer_division=true",(allocator *)&local_78);
    duckdb::Connection::Query((string *)&local_80);
    if (local_80 != (long *)0x0) {
      (**(code **)(*local_80 + 8))();
    }
    local_80 = (long *)0x0;
    std::__cxx11::string::~string((string *)&local_a8);
  }
  unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->(this_00)
  ;
  std::__cxx11::string::string((string *)&local_38,"test_secret_dir",&local_a9);
  TestCreatePath(&local_58,&local_38);
  std::operator+(&local_78,"SET secret_directory=\'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
  std::operator+(&local_a8,&local_78,"\'");
  duckdb::Connection::Query((string *)&local_88);
  if (local_88 != (long *)0x0) {
    (**(code **)(*local_88 + 8))();
  }
  local_88 = (long *)0x0;
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  this_01 = unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
            operator->(this_00);
  pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator*
                     ((shared_ptr<duckdb::ClientContext,_true> *)this_01);
  lVar2 = duckdb::ClientConfig::GetConfig(pCVar1);
  *(undefined2 *)(lVar2 + 0x90) = 1;
  if (this->enable_verification == true) {
    unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
              (this_00);
    duckdb::Connection::EnableQueryVerification();
  }
  if ((this->local_extension_repo)._M_string_length != 0) {
    unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
              (this_00);
    std::operator+(&local_78,"SET autoinstall_extension_repository=\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &this->local_extension_repo);
    std::operator+(&local_a8,&local_78,"\'");
    duckdb::Connection::Query((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_78);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  return;
}

Assistant:

void SQLLogicTestRunner::Reconnect() {
	con = make_uniq<Connection>(*db);
	if (original_sqlite_test) {
		con->Query("SET integer_division=true");
	}
	con->Query("SET secret_directory='" + TestCreatePath("test_secret_dir") + "'");
#ifdef DUCKDB_ALTERNATIVE_VERIFY
	con->Query("SET pivot_filter_threshold=0");
#endif
	auto &client_config = ClientConfig::GetConfig(*con->context);
	client_config.enable_progress_bar = true;
	client_config.print_progress_bar = false;
	if (enable_verification) {
		con->EnableQueryVerification();
	}
	// Set the local extension repo for autoinstalling extensions
	if (!local_extension_repo.empty()) {
		auto res1 = con->Query("SET autoinstall_extension_repository='" + local_extension_repo + "'");
	}
}